

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabColumn(sqlite3_vtab_cursor *pVtabCursor,sqlite3_context *ctx,int i)

{
  int in_EDX;
  sqlite3_context *in_RSI;
  sqlite3_context *in_RDI;
  PragmaVtab *pTab;
  PragmaVtabCursor *pCsr;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  
  if (in_EDX < (int)(uint)*(byte *)((long)&in_RDI->pOut->zMalloc + 1)) {
    sqlite3_column_value((sqlite3_stmt *)in_RSI,in_stack_ffffffffffffffcc);
    sqlite3_result_value
              (in_RSI,(sqlite3_value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
  }
  else {
    sqlite3_result_text(in_RDI,(char *)in_RDI->pOut,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                        (_func_void_void_ptr *)
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return 0;
}

Assistant:

static int pragmaVtabColumn(
  sqlite3_vtab_cursor *pVtabCursor,
  sqlite3_context *ctx,
  int i
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  if( i<pTab->iHidden ){
    sqlite3_result_value(ctx, sqlite3_column_value(pCsr->pPragma, i));
  }else{
    sqlite3_result_text(ctx, pCsr->azArg[i-pTab->iHidden],-1,SQLITE_TRANSIENT);
  }
  return SQLITE_OK;
}